

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Eltwise_x86_avx::forward
          (Eltwise_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  Mat *m;
  Mat *this_00;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  undefined1 auVar12 [32];
  float fVar13;
  undefined1 auVar14 [32];
  int q;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  float *pfVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  pointer pMVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  undefined1 (*pauVar28) [32];
  undefined1 (*pauVar29) [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar4 = m->c;
  uVar15 = (ulong)uVar4;
  iVar19 = m->h * m->w * m->d * m->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar27 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    iVar27 = (this->super_Eltwise).op_type;
    if (iVar27 == 0) {
      pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar17 = 0;
      uVar22 = 0;
      if (0 < (int)uVar4) {
        uVar22 = uVar15;
      }
      for (; uVar17 != uVar22; uVar17 = uVar17 + 1) {
        lVar21 = this_00->elemsize * this_00->cstep * uVar17;
        pvVar5 = this_00->data;
        lVar20 = pMVar24[1].elemsize * pMVar24[1].cstep * uVar17;
        pvVar6 = pMVar24[1].data;
        lVar23 = m->elemsize * m->cstep * uVar17;
        pvVar7 = m->data;
        lVar25 = 0;
        lVar26 = 0;
        for (iVar27 = 0; iVar27 + 7 < iVar19; iVar27 = iVar27 + 8) {
          pfVar18 = (float *)((long)pvVar6 + lVar26 + lVar20);
          pfVar1 = (float *)((long)pvVar7 + lVar26 + lVar23);
          auVar12._4_4_ = pfVar18[1] * pfVar1[1];
          auVar12._0_4_ = *pfVar18 * *pfVar1;
          auVar12._8_4_ = pfVar18[2] * pfVar1[2];
          auVar12._12_4_ = pfVar18[3] * pfVar1[3];
          auVar12._16_4_ = pfVar18[4] * pfVar1[4];
          auVar12._20_4_ = pfVar18[5] * pfVar1[5];
          auVar12._24_4_ = pfVar18[6] * pfVar1[6];
          auVar12._28_4_ = pfVar18[7];
          *(undefined1 (*) [32])((long)pvVar5 + lVar26 + lVar21) = auVar12;
          lVar26 = lVar26 + 0x20;
          lVar25 = lVar25 + 8;
        }
        for (; iVar27 + 3 < iVar19; iVar27 = iVar27 + 4) {
          pfVar18 = (float *)((long)pvVar6 + lVar26 + lVar20);
          pfVar1 = (float *)((long)pvVar7 + lVar26 + lVar23);
          auVar30._0_4_ = *pfVar18 * *pfVar1;
          auVar30._4_4_ = pfVar18[1] * pfVar1[1];
          auVar30._8_4_ = pfVar18[2] * pfVar1[2];
          auVar30._12_4_ = pfVar18[3] * pfVar1[3];
          *(undefined1 (*) [16])((long)pvVar5 + lVar26 + lVar21) = auVar30;
          lVar26 = lVar26 + 0x10;
          lVar25 = lVar25 + 4;
        }
        for (; (int)lVar25 < iVar19; lVar25 = lVar25 + 1) {
          *(float *)((long)pvVar5 + lVar25 * 4 + lVar21) =
               *(float *)((long)pvVar6 + lVar25 * 4 + lVar20) *
               *(float *)((long)pvVar7 + lVar25 * 4 + lVar23);
        }
      }
      for (uVar17 = 2;
          pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start,
          uVar17 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar24) / 0x48);
          uVar17 = uVar17 + 1) {
        pMVar24 = pMVar24 + uVar17;
        for (uVar16 = 0; uVar16 != uVar22; uVar16 = uVar16 + 1) {
          pvVar5 = pMVar24->data;
          sVar8 = pMVar24->elemsize;
          sVar9 = pMVar24->cstep;
          pfVar18 = (float *)(sVar9 * uVar16 * sVar8 + (long)pvVar5);
          pvVar6 = this_00->data;
          sVar10 = this_00->elemsize;
          sVar11 = this_00->cstep;
          pauVar28 = (undefined1 (*) [32])(sVar11 * uVar16 * sVar10 + (long)pvVar6);
          lVar20 = 0;
          for (iVar27 = 0; iVar27 + 7 < iVar19; iVar27 = iVar27 + 8) {
            auVar14._4_4_ = pfVar18[1] * *(float *)((long)*pauVar28 + 4);
            auVar14._0_4_ = *pfVar18 * *(float *)*pauVar28;
            auVar14._8_4_ = pfVar18[2] * *(float *)((long)*pauVar28 + 8);
            auVar14._12_4_ = pfVar18[3] * *(float *)((long)*pauVar28 + 0xc);
            auVar14._16_4_ = pfVar18[4] * *(float *)((long)*pauVar28 + 0x10);
            auVar14._20_4_ = pfVar18[5] * *(float *)((long)*pauVar28 + 0x14);
            auVar14._24_4_ = pfVar18[6] * *(float *)((long)*pauVar28 + 0x18);
            auVar14._28_4_ = pfVar18[7];
            *pauVar28 = auVar14;
            pfVar18 = pfVar18 + 8;
            pauVar28 = pauVar28 + 1;
            lVar20 = lVar20 + 8;
          }
          for (; iVar27 + 3 < iVar19; iVar27 = iVar27 + 4) {
            auVar31._0_4_ = *pfVar18 * *(float *)*pauVar28;
            auVar31._4_4_ = pfVar18[1] * *(float *)((long)*pauVar28 + 4);
            auVar31._8_4_ = pfVar18[2] * *(float *)((long)*pauVar28 + 8);
            auVar31._12_4_ = pfVar18[3] * *(float *)((long)*pauVar28 + 0xc);
            *(undefined1 (*) [16])*pauVar28 = auVar31;
            pfVar18 = pfVar18 + 4;
            pauVar28 = (undefined1 (*) [32])((long)*pauVar28 + 0x10);
            lVar20 = lVar20 + 4;
          }
          lVar21 = sVar11 * sVar10 * uVar16;
          for (; (int)lVar20 < iVar19; lVar20 = lVar20 + 1) {
            *(float *)((long)pvVar6 + lVar20 * 4 + lVar21) =
                 *(float *)((long)pvVar6 + lVar20 * 4 + lVar21) *
                 *(float *)((long)pvVar5 + lVar20 * 4 + sVar9 * sVar8 * uVar16);
          }
        }
      }
      iVar27 = (this->super_Eltwise).op_type;
    }
    if (iVar27 == 1) {
      uVar22 = 0;
      if (0 < (int)uVar4) {
        uVar22 = uVar15;
      }
      pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->super_Eltwise).coeffs.w == 0) {
        for (uVar17 = 0; uVar17 != uVar22; uVar17 = uVar17 + 1) {
          lVar23 = this_00->elemsize * this_00->cstep * uVar17;
          pvVar5 = this_00->data;
          lVar21 = pMVar24[1].elemsize * pMVar24[1].cstep * uVar17;
          pvVar6 = pMVar24[1].data;
          lVar25 = m->elemsize * m->cstep * uVar17;
          pvVar7 = m->data;
          lVar26 = 0;
          lVar20 = 0;
          for (iVar27 = 0; iVar27 + 7 < iVar19; iVar27 = iVar27 + 8) {
            pfVar18 = (float *)((long)pvVar6 + lVar20 + lVar21);
            pfVar1 = (float *)((long)pvVar7 + lVar20 + lVar25);
            auVar36._0_4_ = *pfVar18 + *pfVar1;
            auVar36._4_4_ = pfVar18[1] + pfVar1[1];
            auVar36._8_4_ = pfVar18[2] + pfVar1[2];
            auVar36._12_4_ = pfVar18[3] + pfVar1[3];
            auVar36._16_4_ = pfVar18[4] + pfVar1[4];
            auVar36._20_4_ = pfVar18[5] + pfVar1[5];
            auVar36._24_4_ = pfVar18[6] + pfVar1[6];
            auVar36._28_4_ = pfVar18[7] + pfVar1[7];
            *(undefined1 (*) [32])((long)pvVar5 + lVar20 + lVar23) = auVar36;
            lVar20 = lVar20 + 0x20;
            lVar26 = lVar26 + 8;
          }
          for (; iVar27 + 3 < iVar19; iVar27 = iVar27 + 4) {
            pfVar18 = (float *)((long)pvVar6 + lVar20 + lVar21);
            pfVar1 = (float *)((long)pvVar7 + lVar20 + lVar25);
            auVar34._0_4_ = *pfVar18 + *pfVar1;
            auVar34._4_4_ = pfVar18[1] + pfVar1[1];
            auVar34._8_4_ = pfVar18[2] + pfVar1[2];
            auVar34._12_4_ = pfVar18[3] + pfVar1[3];
            *(undefined1 (*) [16])((long)pvVar5 + lVar20 + lVar23) = auVar34;
            lVar20 = lVar20 + 0x10;
            lVar26 = lVar26 + 4;
          }
          for (; (int)lVar26 < iVar19; lVar26 = lVar26 + 1) {
            *(float *)((long)pvVar5 + lVar26 * 4 + lVar23) =
                 *(float *)((long)pvVar6 + lVar26 * 4 + lVar21) +
                 *(float *)((long)pvVar7 + lVar26 * 4 + lVar25);
          }
        }
        for (uVar17 = 2;
            pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar17 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar24) /
                            0x48); uVar17 = uVar17 + 1) {
          pMVar24 = pMVar24 + uVar17;
          for (uVar16 = 0; uVar16 != uVar22; uVar16 = uVar16 + 1) {
            pvVar5 = pMVar24->data;
            sVar8 = pMVar24->elemsize;
            sVar9 = pMVar24->cstep;
            pfVar18 = (float *)(sVar9 * uVar16 * sVar8 + (long)pvVar5);
            pvVar6 = this_00->data;
            sVar10 = this_00->elemsize;
            sVar11 = this_00->cstep;
            pauVar28 = (undefined1 (*) [32])(sVar11 * uVar16 * sVar10 + (long)pvVar6);
            lVar20 = 0;
            for (iVar27 = 0; iVar27 + 7 < iVar19; iVar27 = iVar27 + 8) {
              auVar37._0_4_ = *pfVar18 + *(float *)*pauVar28;
              auVar37._4_4_ = pfVar18[1] + *(float *)((long)*pauVar28 + 4);
              auVar37._8_4_ = pfVar18[2] + *(float *)((long)*pauVar28 + 8);
              auVar37._12_4_ = pfVar18[3] + *(float *)((long)*pauVar28 + 0xc);
              auVar37._16_4_ = pfVar18[4] + *(float *)((long)*pauVar28 + 0x10);
              auVar37._20_4_ = pfVar18[5] + *(float *)((long)*pauVar28 + 0x14);
              auVar37._24_4_ = pfVar18[6] + *(float *)((long)*pauVar28 + 0x18);
              auVar37._28_4_ = pfVar18[7] + *(float *)((long)*pauVar28 + 0x1c);
              *pauVar28 = auVar37;
              pfVar18 = pfVar18 + 8;
              pauVar28 = pauVar28 + 1;
              lVar20 = lVar20 + 8;
            }
            for (; iVar27 + 3 < iVar19; iVar27 = iVar27 + 4) {
              auVar35._0_4_ = *pfVar18 + *(float *)*pauVar28;
              auVar35._4_4_ = pfVar18[1] + *(float *)((long)*pauVar28 + 4);
              auVar35._8_4_ = pfVar18[2] + *(float *)((long)*pauVar28 + 8);
              auVar35._12_4_ = pfVar18[3] + *(float *)((long)*pauVar28 + 0xc);
              *(undefined1 (*) [16])*pauVar28 = auVar35;
              pfVar18 = pfVar18 + 4;
              pauVar28 = (undefined1 (*) [32])((long)*pauVar28 + 0x10);
              lVar20 = lVar20 + 4;
            }
            lVar21 = sVar11 * sVar10 * uVar16;
            for (; (int)lVar20 < iVar19; lVar20 = lVar20 + 1) {
              *(float *)((long)pvVar6 + lVar20 * 4 + lVar21) =
                   *(float *)((long)pvVar6 + lVar20 * 4 + lVar21) +
                   *(float *)((long)pvVar5 + lVar20 * 4 + sVar9 * sVar8 * uVar16);
            }
          }
        }
      }
      else {
        for (uVar17 = 0; uVar17 != uVar22; uVar17 = uVar17 + 1) {
          pfVar18 = (float *)(this->super_Eltwise).coeffs.data;
          fVar2 = *pfVar18;
          auVar32._4_4_ = fVar2;
          auVar32._0_4_ = fVar2;
          auVar32._8_4_ = fVar2;
          auVar32._12_4_ = fVar2;
          fVar3 = pfVar18[1];
          auVar38._4_4_ = fVar3;
          auVar38._0_4_ = fVar3;
          auVar38._8_4_ = fVar3;
          auVar38._12_4_ = fVar3;
          in_ZMM1 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,auVar38
                                                                                      )))));
          lVar23 = m->elemsize * m->cstep * uVar17;
          pvVar5 = m->data;
          lVar25 = pMVar24[1].elemsize * pMVar24[1].cstep * uVar17;
          pvVar6 = pMVar24[1].data;
          lVar21 = this_00->elemsize * this_00->cstep * uVar17;
          pvVar7 = this_00->data;
          lVar26 = 0;
          lVar20 = 0;
          for (iVar27 = 0; iVar27 + 7 < iVar19; iVar27 = iVar27 + 8) {
            pfVar18 = (float *)((long)pvVar5 + lVar20 + lVar23);
            pfVar1 = (float *)((long)pvVar6 + lVar20 + lVar25);
            auVar42._0_4_ = fVar3 * *pfVar1;
            auVar42._4_4_ = fVar3 * pfVar1[1];
            auVar42._8_4_ = fVar3 * pfVar1[2];
            auVar42._12_4_ = fVar3 * pfVar1[3];
            auVar42._16_4_ = fVar3 * pfVar1[4];
            auVar42._20_4_ = fVar3 * pfVar1[5];
            auVar42._28_36_ = in_ZMM3._28_36_;
            auVar42._24_4_ = fVar3 * pfVar1[6];
            auVar41._0_4_ = auVar42._0_4_ + fVar2 * *pfVar18;
            auVar41._4_4_ = auVar42._4_4_ + fVar2 * pfVar18[1];
            auVar41._8_4_ = auVar42._8_4_ + fVar2 * pfVar18[2];
            auVar41._12_4_ = auVar42._12_4_ + fVar2 * pfVar18[3];
            auVar41._16_4_ = auVar42._16_4_ + fVar2 * pfVar18[4];
            auVar41._20_4_ = auVar42._20_4_ + fVar2 * pfVar18[5];
            auVar41._24_4_ = auVar42._24_4_ + fVar2 * pfVar18[6];
            auVar41._28_4_ = in_ZMM3._28_4_ + in_ZMM2._28_4_;
            in_ZMM2 = ZEXT3264(auVar41);
            *(undefined1 (*) [32])((long)pvVar7 + lVar20 + lVar21) = auVar41;
            lVar20 = lVar20 + 0x20;
            lVar26 = lVar26 + 8;
            in_ZMM3 = ZEXT3264(auVar42._0_32_);
          }
          auVar30 = vshufps_avx(auVar32,auVar32,0);
          in_ZMM2 = ZEXT1664(auVar30);
          auVar31 = vshufps_avx(auVar38,auVar38,0);
          in_ZMM3 = ZEXT1664(auVar31);
          for (; iVar27 + 3 < iVar19; iVar27 = iVar27 + 4) {
            pfVar18 = (float *)((long)pvVar5 + lVar20 + lVar23);
            pfVar1 = (float *)((long)pvVar6 + lVar20 + lVar25);
            auVar43._0_4_ = auVar31._0_4_ * *pfVar1 + auVar30._0_4_ * *pfVar18;
            auVar43._4_4_ = auVar31._4_4_ * pfVar1[1] + auVar30._4_4_ * pfVar18[1];
            auVar43._8_4_ = auVar31._8_4_ * pfVar1[2] + auVar30._8_4_ * pfVar18[2];
            auVar43._12_4_ = auVar31._12_4_ * pfVar1[3] + auVar30._12_4_ * pfVar18[3];
            *(undefined1 (*) [16])((long)pvVar7 + lVar20 + lVar21) = auVar43;
            lVar20 = lVar20 + 0x10;
            lVar26 = lVar26 + 4;
          }
          for (; (int)lVar26 < iVar19; lVar26 = lVar26 + 1) {
            fVar13 = fVar3 * *(float *)((long)pvVar6 + lVar26 * 4 + lVar25);
            in_ZMM3 = ZEXT464((uint)fVar13);
            fVar13 = fVar13 + fVar2 * *(float *)((long)pvVar5 + lVar26 * 4 + lVar23);
            in_ZMM2 = ZEXT464((uint)fVar13);
            *(float *)((long)pvVar7 + lVar26 * 4 + lVar21) = fVar13;
          }
        }
        for (uVar17 = 2;
            pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar17 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar24) /
                            0x48); uVar17 = uVar17 + 1) {
          pMVar24 = pMVar24 + uVar17;
          for (uVar16 = 0; uVar16 != uVar22; uVar16 = uVar16 + 1) {
            pvVar5 = pMVar24->data;
            sVar8 = pMVar24->elemsize;
            sVar9 = pMVar24->cstep;
            pfVar18 = (float *)(sVar9 * uVar16 * sVar8 + (long)pvVar5);
            pvVar6 = this_00->data;
            sVar10 = this_00->elemsize;
            sVar11 = this_00->cstep;
            pauVar28 = (undefined1 (*) [32])(sVar11 * uVar16 * sVar10 + (long)pvVar6);
            fVar2 = *(float *)((long)(this->super_Eltwise).coeffs.data + uVar17 * 4);
            auVar33._4_4_ = fVar2;
            auVar33._0_4_ = fVar2;
            auVar33._8_4_ = fVar2;
            auVar33._12_4_ = fVar2;
            lVar20 = 0;
            for (iVar27 = 0; iVar27 + 7 < iVar19; iVar27 = iVar27 + 8) {
              auVar39._0_4_ = fVar2 * *pfVar18 + *(float *)*pauVar28;
              auVar39._4_4_ = fVar2 * pfVar18[1] + *(float *)((long)*pauVar28 + 4);
              auVar39._8_4_ = fVar2 * pfVar18[2] + *(float *)((long)*pauVar28 + 8);
              auVar39._12_4_ = fVar2 * pfVar18[3] + *(float *)((long)*pauVar28 + 0xc);
              auVar39._16_4_ = fVar2 * pfVar18[4] + *(float *)((long)*pauVar28 + 0x10);
              auVar39._20_4_ = fVar2 * pfVar18[5] + *(float *)((long)*pauVar28 + 0x14);
              auVar39._24_4_ = fVar2 * pfVar18[6] + *(float *)((long)*pauVar28 + 0x18);
              auVar39._28_4_ = in_ZMM1._28_4_ + *(float *)((long)*pauVar28 + 0x1c);
              in_ZMM1 = ZEXT3264(auVar39);
              *pauVar28 = auVar39;
              pfVar18 = pfVar18 + 8;
              pauVar28 = pauVar28 + 1;
              lVar20 = lVar20 + 8;
            }
            auVar30 = vshufps_avx(auVar33,auVar33,0);
            in_ZMM1 = ZEXT1664(auVar30);
            for (; iVar27 + 3 < iVar19; iVar27 = iVar27 + 4) {
              auVar40._0_4_ = auVar30._0_4_ * *pfVar18 + *(float *)*pauVar28;
              auVar40._4_4_ = auVar30._4_4_ * pfVar18[1] + *(float *)((long)*pauVar28 + 4);
              auVar40._8_4_ = auVar30._8_4_ * pfVar18[2] + *(float *)((long)*pauVar28 + 8);
              auVar40._12_4_ = auVar30._12_4_ * pfVar18[3] + *(float *)((long)*pauVar28 + 0xc);
              *(undefined1 (*) [16])*pauVar28 = auVar40;
              pfVar18 = pfVar18 + 4;
              pauVar28 = (undefined1 (*) [32])((long)*pauVar28 + 0x10);
              lVar20 = lVar20 + 4;
            }
            lVar21 = sVar11 * sVar10 * uVar16;
            for (; (int)lVar20 < iVar19; lVar20 = lVar20 + 1) {
              fVar3 = fVar2 * *(float *)((long)pvVar5 + lVar20 * 4 + sVar9 * sVar8 * uVar16) +
                      *(float *)((long)pvVar6 + lVar20 * 4 + lVar21);
              in_ZMM1 = ZEXT464((uint)fVar3);
              *(float *)((long)pvVar6 + lVar20 * 4 + lVar21) = fVar3;
            }
          }
        }
      }
    }
    iVar27 = 0;
    if ((this->super_Eltwise).op_type == 2) {
      uVar22 = 2;
      pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar17 = 0;
      if ((int)uVar4 < 1) {
        uVar15 = uVar17;
      }
      for (; uVar17 != uVar15; uVar17 = uVar17 + 1) {
        lVar20 = m->elemsize * m->cstep * uVar17;
        pvVar5 = m->data;
        lVar23 = pMVar24[1].elemsize * pMVar24[1].cstep * uVar17;
        pvVar6 = pMVar24[1].data;
        lVar21 = this_00->elemsize * this_00->cstep * uVar17;
        pvVar7 = this_00->data;
        lVar25 = 0;
        lVar26 = 0;
        for (iVar27 = 0; iVar27 + 7 < iVar19; iVar27 = iVar27 + 8) {
          auVar12 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar5 + lVar26 + lVar20),
                               *(undefined1 (*) [32])((long)pvVar6 + lVar26 + lVar23));
          *(undefined1 (*) [32])((long)pvVar7 + lVar26 + lVar21) = auVar12;
          lVar26 = lVar26 + 0x20;
          lVar25 = lVar25 + 8;
        }
        for (; iVar27 + 3 < iVar19; iVar27 = iVar27 + 4) {
          auVar30 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar5 + lVar26 + lVar20),
                               *(undefined1 (*) [16])((long)pvVar6 + lVar26 + lVar23));
          *(undefined1 (*) [16])((long)pvVar7 + lVar26 + lVar21) = auVar30;
          lVar26 = lVar26 + 0x10;
          lVar25 = lVar25 + 4;
        }
        for (; (int)lVar25 < iVar19; lVar25 = lVar25 + 1) {
          auVar30 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar6 + lVar25 * 4 + lVar23)),
                               ZEXT416(*(uint *)((long)pvVar5 + lVar25 * 4 + lVar20)));
          *(int *)((long)pvVar7 + lVar25 * 4 + lVar21) = auVar30._0_4_;
        }
      }
      for (; pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start,
          uVar22 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar24) / 0x48);
          uVar22 = uVar22 + 1) {
        pMVar24 = pMVar24 + uVar22;
        for (uVar17 = 0; uVar17 != uVar15; uVar17 = uVar17 + 1) {
          pvVar5 = pMVar24->data;
          sVar8 = pMVar24->elemsize;
          sVar9 = pMVar24->cstep;
          pauVar28 = (undefined1 (*) [32])(sVar9 * uVar17 * sVar8 + (long)pvVar5);
          pvVar6 = this_00->data;
          sVar10 = this_00->elemsize;
          sVar11 = this_00->cstep;
          pauVar29 = (undefined1 (*) [32])(sVar11 * uVar17 * sVar10 + (long)pvVar6);
          lVar20 = 0;
          for (iVar27 = 0; iVar27 + 7 < iVar19; iVar27 = iVar27 + 8) {
            auVar12 = vmaxps_avx(*pauVar29,*pauVar28);
            *pauVar29 = auVar12;
            pauVar28 = pauVar28 + 1;
            pauVar29 = pauVar29 + 1;
            lVar20 = lVar20 + 8;
          }
          for (; iVar27 + 3 < iVar19; iVar27 = iVar27 + 4) {
            auVar30 = vmaxps_avx(*(undefined1 (*) [16])*pauVar29,*(undefined1 (*) [16])*pauVar28);
            *(undefined1 (*) [16])*pauVar29 = auVar30;
            pauVar28 = (undefined1 (*) [32])(*pauVar28 + 0x10);
            pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
            lVar20 = lVar20 + 4;
          }
          lVar21 = sVar11 * sVar10 * uVar17;
          for (; (int)lVar20 < iVar19; lVar20 = lVar20 + 1) {
            auVar30 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar6 + lVar20 * 4 + lVar21)),
                                 ZEXT416(*(uint *)((long)pvVar5 +
                                                  lVar20 * 4 + sVar9 * sVar8 * uVar17)));
            *(int *)((long)pvVar6 + lVar20 * 4 + lVar21) = auVar30._0_4_;
          }
        }
      }
      iVar27 = 0;
    }
  }
  return iVar27;
}

Assistant:

int Eltwise_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * d * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}